

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int SetBaseCfgublox(UBLOX *publox)

{
  int *ppacketlen;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int3 iStack_308;
  int iStack_304;
  CFG_TMODE3_PL_UBX cfg_tmode3_pl;
  uchar auStack_2d8 [8];
  CFG_NMEA_PL_UBX cfg_nmea_pl;
  uchar local_2b8 [8];
  uchar cfg_msg_pl [8];
  uchar local_2a8 [4];
  int packetlen;
  uchar packet [128];
  int offset;
  int sendbuflen;
  uchar sendbuf [512];
  UBLOX *publox_local;
  
  cfg_msg_pl[4] = '\0';
  cfg_msg_pl[5] = '\0';
  cfg_msg_pl[6] = '\0';
  cfg_msg_pl[7] = '\0';
  local_2b8[0] = 0xf5;
  local_2b8[1] = '\x05';
  local_2b8[2] = '\0';
  local_2b8[3] = '\x01';
  local_2b8[4] = '\0';
  local_2b8[5] = '\x01';
  local_2b8[6] = '\0';
  local_2b8[7] = '\0';
  ppacketlen = (int *)(cfg_msg_pl + 4);
  sendbuf._504_8_ = publox;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy(&offset,local_2a8,(long)(int)cfg_msg_pl._4_4_);
  uVar1 = cfg_msg_pl._4_4_;
  local_2b8[1] = 0x4d;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)(int)uVar1),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = uVar1 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0x57;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0x61;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0x7f;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0xe6;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0xfe;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[0] = 0xf0;
  local_2b8[1] = '\0';
  local_2b8[2] = '\0';
  local_2b8[3] = '\0';
  local_2b8[4] = '\0';
  local_2b8[5] = '\0';
  local_2b8[6] = '\0';
  local_2b8[7] = '\0';
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 1;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 2;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 3;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 4;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 5;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 7;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 8;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  local_2b8[1] = 0xd;
  EncodePacketUBX(local_2a8,ppacketlen,6,1,local_2b8,8);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  cfg_nmea_pl.svNumbering = '\0';
  cfg_nmea_pl.mainTalkerId = '\0';
  cfg_nmea_pl.gsvTalkerId = '\0';
  cfg_nmea_pl.version = '\0';
  auStack_2d8[0] = '\0';
  auStack_2d8[1] = '#';
  auStack_2d8[2] = '\0';
  auStack_2d8[3] = '\n';
  auStack_2d8[4] = '\0';
  auStack_2d8[5] = '\0';
  auStack_2d8[6] = '\0';
  auStack_2d8[7] = '\0';
  cfg_nmea_pl.filter = (filter_CFG_NMEA_PL_UBX)0x0;
  cfg_nmea_pl.nmeaVersion = '\0';
  cfg_nmea_pl.numSV = '\0';
  cfg_nmea_pl.flags = (flags_CFG_NMEA_PL_UBX)0x1;
  cfg_nmea_pl.gnssToFilter = (gnssToFilter_CFG_NMEA_PL_UBX)0x0;
  EncodePacketUBX(local_2a8,ppacketlen,6,0x17,auStack_2d8,0x14);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = iVar2 + cfg_msg_pl._4_4_;
  cfg_tmode3_pl.svinMinDur = 0;
  cfg_tmode3_pl.svinAccLimit = 0;
  iStack_308 = (uint3)*(byte *)(sendbuf._504_8_ + 0x6f0) << 0x10;
  iVar3 = (int)(*(double *)(sendbuf._504_8_ + 0x704) * 10000000.0);
  _iStack_308 = CONCAT44(iVar3,CONCAT13(1,iStack_308));
  iVar4 = (int)(*(double *)(sendbuf._504_8_ + 0x70c) * 10000000.0);
  cfg_tmode3_pl.ecefXOrLat = (int)(*(double *)(sendbuf._504_8_ + 0x714) * 100.0);
  cfg_tmode3_pl.version = (char)iVar4;
  cfg_tmode3_pl.reserved1 = (char)((uint)iVar4 >> 8);
  cfg_tmode3_pl.flags = (flags_CFG_TMODE3_PL_UBX)(short)((uint)iVar4 >> 0x10);
  cfg_tmode3_pl.ecefYOrLon._1_1_ =
       (char)(int)((*(double *)(sendbuf._504_8_ + 0x70c) * 10000000.0 - (double)iVar4) * 100.0);
  cfg_tmode3_pl.ecefYOrLon._0_1_ =
       (char)(int)((*(double *)(sendbuf._504_8_ + 0x704) * 10000000.0 - (double)iVar3) * 100.0);
  cfg_tmode3_pl.ecefYOrLon._2_1_ =
       (char)(int)((*(double *)(sendbuf._504_8_ + 0x714) * 100.0 - (double)cfg_tmode3_pl.ecefXOrLat)
                  * 100.0);
  cfg_tmode3_pl.ecefYOrLon._3_1_ = 0;
  cfg_tmode3_pl.ecefZOrAlt = (int)(long)(*(double *)(sendbuf._504_8_ + 0x71c) * 10000.0);
  cfg_tmode3_pl.fixedPosAcc = (uint)(long)(*(double *)(sendbuf._504_8_ + 0x6fc) * 10000.0);
  cfg_tmode3_pl._16_4_ = (int)(long)*(double *)(sendbuf._504_8_ + 0x6f4);
  EncodePacketUBX(local_2a8,(int *)(cfg_msg_pl + 4),6,0x71,(uchar *)&iStack_308,0x28);
  memcpy((void *)((long)&offset + (long)iVar2),local_2a8,(long)(int)cfg_msg_pl._4_4_);
  iVar2 = cfg_msg_pl._4_4_ + iVar2;
  iVar3 = WriteAllRS232Port((RS232PORT *)sendbuf._504_8_,(uint8 *)&offset,iVar2);
  if (iVar3 == 0) {
    if ((*(int *)(sendbuf._504_8_ + 0x6e4) != 0) && (*(long *)(sendbuf._504_8_ + 0x318) != 0)) {
      fwrite(&offset,(long)iVar2,1,*(FILE **)(sendbuf._504_8_ + 0x318));
      fflush(*(FILE **)(sendbuf._504_8_ + 0x318));
    }
    publox_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a ublox. \n");
    publox_local._4_4_ = 1;
  }
  return publox_local._4_4_;
}

Assistant:

inline int SetBaseCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;
	struct CFG_TMODE3_PL_UBX cfg_tmode3_pl;

	// Enable 1005, 1077, 1087, 1127 RTCM messages on UART1 and USB.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = RTCM_CLASS_UBX;
	cfg_msg_pl[1] = RTCM_1005_ID_UBX;
	cfg_msg_pl[3] = 1; // UART1 rate.
	cfg_msg_pl[5] = 1; // USB rate.
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1077_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1087_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1097_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1127_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1230_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_4072_0_ID_UBX; // For moving base, not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	// Disable GGA, GLL, GSA, GSV, RMC, VTG, GST, ZDA, GNS NMEA messages.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GLL_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSV_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_VTG_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GST_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_ZDA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GNS_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_TXT_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Output Protocol...

	// Activate Self-Survey-In or Fixed-Position-Mode.
	memset(&cfg_tmode3_pl, 0, sizeof(cfg_tmode3_pl));
	cfg_tmode3_pl.flags.lla = 1;
	cfg_tmode3_pl.flags.mode = (unsigned short)publox->SurveyMode;
	cfg_tmode3_pl.ecefXOrLat = (int)(publox->fixedLat*10000000);
	cfg_tmode3_pl.ecefYOrLon = (int)(publox->fixedLon*10000000);
	cfg_tmode3_pl.ecefZOrAlt = (int)(publox->fixedAlt*100);
	cfg_tmode3_pl.ecefXOrLatHP = (char)((publox->fixedLat*10000000-cfg_tmode3_pl.ecefXOrLat)*100);
	cfg_tmode3_pl.ecefYOrLonHP = (char)((publox->fixedLon*10000000-cfg_tmode3_pl.ecefYOrLon)*100);
	cfg_tmode3_pl.ecefZOrAltHP = (char)((publox->fixedAlt*100-cfg_tmode3_pl.ecefZOrAlt)*100);
	cfg_tmode3_pl.fixedPosAcc = (unsigned int)(publox->fixedPosAcc*10000);
	cfg_tmode3_pl.svinMinDur = (unsigned int)publox->svinMinDur;
	cfg_tmode3_pl.svinAccLimit = (unsigned int)(publox->svinAccLimit*10000);
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, LEN_CFG_TMODE3_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, sizeof(cfg_tmode3_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}